

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void __thiscall DBaseDecal::Destroy(DBaseDecal *this)

{
  DBaseDecal *pDVar1;
  DBaseDecal *pDVar2;
  
  pDVar1 = this->WallPrev;
  if (pDVar1 == (DBaseDecal *)0x0) {
    pDVar2 = this->WallNext;
    if (this->Side != (side_t *)0x0) {
      this->Side->AttachedDecals = pDVar2;
    }
  }
  else {
    pDVar2 = this->WallNext;
    pDVar1->WallNext = pDVar2;
  }
  if (pDVar2 != (DBaseDecal *)0x0) {
    pDVar2->WallPrev = pDVar1;
  }
  this->WallNext = (DBaseDecal *)0x0;
  this->WallPrev = (DBaseDecal *)0x0;
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DBaseDecal::Remove ()
{
	if (WallPrev == nullptr)
	{
		if (Side != nullptr) Side->AttachedDecals = WallNext;
	}
	else WallPrev->WallNext = WallNext;

	if (WallNext != nullptr) WallNext->WallPrev = WallPrev;

	WallPrev = nullptr;
	WallNext = nullptr;
}